

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O2

int testStorageReaderTestsIncorrectMetadata(void)

{
  string *this;
  string *psVar1;
  ostream *poVar2;
  initializer_list<unsigned_short> __l;
  Span<unsigned_short,_18446744073709551615UL> data;
  allocator_type local_109;
  vector<unsigned_short,_std::allocator<unsigned_short>_> bytes;
  string local_f0;
  AutoDeleteTempFile tempfile;
  StorageReader reader;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  memcpy(&reader,&DAT_002e66ca,0x88);
  __l._M_len = 0x44;
  __l._M_array = (iterator)&reader;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&bytes,__l,&local_109);
  this = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  psVar1 = (string *)0x0;
  if ((long)bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    psVar1 = (string *)
             bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  data.m_ptr = (pointer)((long)bytes.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)bytes.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 1);
  data.m_size.m_size =
       (size_t)bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
  MILBlob::TestUtil::WriteBlobFile<unsigned_short,18446744073709551615ul>
            ((TestUtil *)this,psVar1,data);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  std::__cxx11::string::string((string *)&local_f0,(string *)psVar1);
  MILBlob::Blob::StorageReader::StorageReader(&reader,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  MILBlob::Blob::StorageReader::GetDataView<unsigned_char>(&reader,0);
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xda);
  std::operator<<(poVar2,": expected exception, but none thrown.\n");
  MILBlob::Blob::StorageReader::~StorageReader(&reader);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return 1;
}

Assistant:

int testStorageReaderTestsIncorrectMetadata()
{
    AutoDeleteTempFile tempfile;

    {
        // clang-format off
        std::vector<uint16_t> bytes {
            // HEADER
            0x0001, 0x0000, 0x0002, 0x0000,  // count=1, version=2
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_0
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_1
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_2
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_3
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_4
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_5
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_6
            // METADATA
            0xBEEF, 0xDEAD, 0x000E, 0x0000,  // sentinel=0xDEADBEEF, mil_dtype=uint8_t
            0x0008, 0x0000, 0x0000, 0x0000,  // sizeInBytes=8 bytes
            0x0060, 0x0000, 0x0000, 0x0000,  // offset
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_0
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_1
            0x0001, 0x0000, 0x0000, 0x0000,  // reserved_2
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_3
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_4
            // DATA (8 bytes)
            0x0000, 0x0000, 0x0000, 0x0000
        };
        // clang-format on

        TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::MakeSpan(bytes));
    }

    StorageReader reader(tempfile.GetFilename());
    ML_ASSERT_THROWS_WITH_MESSAGE(reader.GetDataView<uint8_t>(0),
                                  std::runtime_error,
                                  "Invalid sentinel in blob_metadata.");

    return 0;
}